

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  undefined1 local_50 [8];
  StrAccum acc;
  __va_list_tag *ap_local;
  char *zFormat_local;
  char *zBuf_local;
  int n_local;
  
  if (0 < n) {
    acc._24_8_ = ap;
    sqlite3StrAccumInit((StrAccum *)local_50,(sqlite3 *)0x0,zBuf,n,0);
    sqlite3_str_vappendf((sqlite3_str *)local_50,zFormat,(__va_list_tag *)acc._24_8_);
    zBuf[acc.nAlloc] = '\0';
  }
  return zBuf;
}

Assistant:

SQLITE_API char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap){
  StrAccum acc;
  if( n<=0 ) return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( zBuf==0 || zFormat==0 ) {
    (void)SQLITE_MISUSE_BKPT;
    if( zBuf ) zBuf[0] = 0;
    return zBuf;
  }
#endif
  sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  zBuf[acc.nChar] = 0;
  return zBuf;
}